

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

long days_untill_month(Month month,uint32_t year)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  
  days_in_months(year);
  lVar2 = (long)(int)month;
  piVar3 = days_in_months::days_in_months;
  lVar1 = 0;
  while (lVar2 = lVar2 + -1, lVar2 != 0) {
    lVar1 = lVar1 + *piVar3;
    piVar3 = piVar3 + 1;
  }
  return lVar1;
}

Assistant:

long days_untill_month(Month month, uint32_t year)
{
	long days{ 0 };
	int* months = days_in_months(year);
	for (size_t i = 0; i < (size_t(month) - 1); ++i)
	{
		days += months[i];
	}
	return days;
}